

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

QVariant * __thiscall QVariantAnimationPrivate::valueAt(QVariantAnimationPrivate *this,qreal step)

{
  bool bVar1;
  const_iterator cVar2;
  pair<double,_QVariant> *p2;
  pair<double,_QVariant> *in_RDI;
  long in_FS_OFFSET;
  const_iterator result;
  pair<double,_QVariant> sought;
  QVariant *in_stack_fffffffffffffef8;
  pair<double,_QVariant> *in_stack_ffffffffffffff00;
  _func_bool_pair<double,_QVariant>_ptr_pair<double,_QVariant>_ptr *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  const_iterator in_stack_ffffffffffffff30;
  const_iterator local_68 [6];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = -NAN;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  cVar2.i = in_RDI;
  ::QVariant::QVariant((QVariant *)0x68e491);
  std::pair<double,_QVariant>::pair<double_&,_QVariant,_true>
            (in_stack_ffffffffffffff00,(double *)in_stack_fffffffffffffef8,(QVariant *)0x68e4ab);
  ::QVariant::~QVariant((QVariant *)in_stack_ffffffffffffff00);
  local_68[0].i = (pair<double,_QVariant> *)&DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<double,_QVariant>_>::cbegin
            ((QList<std::pair<double,_QVariant>_> *)in_stack_ffffffffffffff00);
  QList<std::pair<double,_QVariant>_>::cend
            ((QList<std::pair<double,_QVariant>_> *)in_stack_ffffffffffffff00);
  local_68[0] = std::
                lower_bound<QList<std::pair<double,QVariant>>::const_iterator,std::pair<double,QVariant>,bool(*)(std::pair<double,QVariant>const&,std::pair<double,QVariant>const&)>
                          (cVar2,in_stack_ffffffffffffff30,
                           (pair<double,_QVariant> *)
                           CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08);
  cVar2 = QList<std::pair<double,_QVariant>_>::cend(in_stack_ffffffffffffff00);
  bVar1 = QList<std::pair<double,_QVariant>_>::const_iterator::operator!=(local_68,cVar2);
  if (bVar1) {
    p2 = QList<std::pair<double,_QVariant>_>::const_iterator::operator*(local_68);
    bVar1 = animationValueLessThan((KeyValue *)local_38,p2);
    if (!bVar1) {
      QList<std::pair<double,_QVariant>_>::const_iterator::operator->(local_68);
      ::QVariant::QVariant((QVariant *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      goto LAB_0068e630;
    }
  }
  ::QVariant::QVariant((QVariant *)0x68e628);
LAB_0068e630:
  std::pair<double,_QVariant>::~pair((pair<double,_QVariant> *)0x68e63d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)in_RDI;
}

Assistant:

QVariant QVariantAnimationPrivate::valueAt(qreal step) const
{
    const auto sought = std::pair{step, QVariant()};
    const auto result = std::lower_bound(keyValues.cbegin(), keyValues.cend(), sought,
                                         animationValueLessThan);
    if (result != keyValues.cend() && !animationValueLessThan(sought, *result))
        return result->second;

    return QVariant();
}